

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

Status cmsys::SystemTools::CopyFileIfDifferent(string *source,string *destination)

{
  bool bVar1;
  __type _Var2;
  Status SVar3;
  string new_destination;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string new_destination_1;
  
  bVar1 = FileIsDirectory(destination);
  if (bVar1) {
    std::__cxx11::string::string((string *)&new_destination_1,(string *)destination);
    ConvertToUnixSlashes(&new_destination_1);
    std::operator+(&local_60,&new_destination_1,'/');
    GetFilenameName(&local_80,source);
    std::operator+(&new_destination,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&new_destination_1);
    _Var2 = std::operator==(&new_destination,destination);
    if (!_Var2) {
      destination = (string *)CopyFileIfDifferent(source,&new_destination);
    }
    std::__cxx11::string::~string((string *)&new_destination);
    if (!_Var2) {
      return (Status)destination;
    }
  }
  else {
    bVar1 = FilesDiffer(source,destination);
    if (bVar1) {
      SVar3 = CopyFileAlways(source,destination);
      return SVar3;
    }
  }
  SVar3.Kind_ = Success;
  SVar3.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
  return SVar3;
}

Assistant:

Status SystemTools::CopyFileIfDifferent(std::string const& source,
                                        std::string const& destination)
{
  // special check for a destination that is a directory
  // FilesDiffer does not handle file to directory compare
  if (SystemTools::FileIsDirectory(destination)) {
    const std::string new_destination = FileInDir(source, destination);
    if (!SystemTools::ComparePath(new_destination, destination)) {
      return SystemTools::CopyFileIfDifferent(source, new_destination);
    }
  } else {
    // source and destination are files so do a copy if they
    // are different
    if (SystemTools::FilesDiffer(source, destination)) {
      return SystemTools::CopyFileAlways(source, destination);
    }
  }
  // at this point the files must be the same so return true
  return Status::Success();
}